

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O3

void select_test(void)

{
  uint64_t *puVar1;
  ulong uVar2;
  _Bool _Var3;
  int iVar4;
  bitset_container_t *container;
  uint uVar5;
  ulong uVar6;
  uint32_t rank;
  ulong uVar7;
  uint16_t value;
  unsigned_long b;
  uint32_t element;
  uint32_t start_rank;
  undefined8 local_38;
  
  container = bitset_container_create();
  _assert_true((unsigned_long)container,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x129);
  puVar1 = container->words;
  iVar4 = container->cardinality;
  uVar6 = 0x16;
  do {
    uVar5 = (int)uVar6 + 5;
    uVar6 = (ulong)uVar5;
    uVar2 = puVar1[uVar5 >> 6];
    uVar7 = uVar2 | 1L << (uVar6 & 0x3f);
    iVar4 = iVar4 + (int)((uVar2 ^ uVar7) >> ((byte)uVar5 & 0x3f));
    puVar1[uVar5 >> 6] = uVar7;
  } while (uVar5 < 0xde);
  container->cardinality = iVar4;
  local_38 = 0;
  b = 0x1b;
  rank = 0xc;
  do {
    local_38 = CONCAT44(0xc,(uint32_t)local_38);
    _Var3 = bitset_container_select
                      (container,(uint32_t *)((long)&local_38 + 4),rank,(uint32_t *)&local_38);
    _assert_true((ulong)_Var3,"bitset_container_select(B, &start_rank, i + 12, &element)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                 ,0x133);
    _assert_int_equal(local_38 & 0xffffffff,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                      ,0x134);
    b = b + 5;
    rank = rank + 1;
  } while (rank != 0x34);
  local_38._4_4_ = 0xc;
  _Var3 = bitset_container_select
                    (container,(uint32_t *)((long)&local_38 + 4),0x34,(uint32_t *)&local_38);
  _assert_true((ulong)!_Var3,"bitset_container_select(B, &start_rank, i + 12, &element)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
               ,0x138);
  _assert_int_equal((ulong)local_38._4_4_,0x34,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/bitset_container_unit.c"
                    ,0x139);
  bitset_container_free(container);
  return;
}

Assistant:

DEFINE_TEST(select_test) {
    bitset_container_t* B = bitset_container_create();
    assert_non_null(B);
    uint16_t base = 27;
    for (uint16_t value = base; value < base + 200; value += 5) {
        bitset_container_add(B, value);
    }
    uint32_t i = 0;
    uint32_t element = 0;
    uint32_t start_rank;
    for (uint16_t value = base; value < base + 200; value += 5) {
        start_rank = 12;
        assert_true(bitset_container_select(B, &start_rank, i + 12, &element));
        assert_int_equal(element, value);
        i++;
    }
    start_rank = 12;
    assert_false(bitset_container_select(B, &start_rank, i + 12, &element));
    assert_int_equal(start_rank, i + 12);
    bitset_container_free(B);
}